

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

bool slang::ast::AssertionInstanceExpression::checkAssertionArg
               (PropertyExprSyntax *propExpr,AssertionPortSymbol *formal,ASTContext *context,
               ActualArg *result,bool isRecursiveProp)

{
  bool bVar1;
  int iVar2;
  type expr;
  int *piVar3;
  Type *this;
  Type *pTVar4;
  Expression *pEVar5;
  undefined4 extraout_var_00;
  ValueSymbol *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Diagnostic *pDVar6;
  socklen_t __len;
  DiagCode code;
  undefined7 in_register_00000081;
  SourceRange SVar7;
  Expression *local_90;
  int *local_88;
  long local_80;
  ASTContext ctx;
  undefined4 extraout_var;
  
  decomposePropExpr(propExpr);
  ctx.assertionInstance = context->assertionInstance;
  ctx.scope.ptr = (context->scope).ptr;
  ctx.lookupIndex = context->lookupIndex;
  ctx._12_4_ = *(undefined4 *)&context->field_0xc;
  ctx.flags.m_bits = (context->flags).m_bits;
  ctx.instanceOrProc = context->instanceOrProc;
  ctx.firstTempVar = context->firstTempVar;
  ctx.randomizeDetails = context->randomizeDetails;
  if (((int)CONCAT71(in_register_00000081,isRecursiveProp) != 0) &&
     ((formal->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged == false)) {
    piVar3 = local_88;
    if (local_88 != (int *)0x0) {
      for (; *piVar3 == 0x167; piVar3 = *(int **)(piVar3 + 10)) {
      }
      if (*piVar3 == 0xe5) goto LAB_003391e8;
    }
    ctx.flags.m_bits = ctx.flags.m_bits | 0x800000;
  }
LAB_003391e8:
  this = DeclaredType::getType(&formal->declaredType);
  pTVar4 = Type::getCanonicalType(this);
  switch((pTVar4->super_Symbol).kind) {
  case EventType:
    iVar2 = TimingControl::bind((int)propExpr,(sockaddr *)&ctx,__len);
    pEVar5 = (Expression *)CONCAT44(extraout_var,iVar2);
    local_90 = pEVar5;
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                 *)result,(TimingControl **)&local_90);
    goto LAB_003393d7;
  default:
    if (local_88 == (int *)0x0) {
      SVar7 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
      pDVar6 = ASTContext::addDiag(&ctx,(DiagCode)0x20007,SVar7);
LAB_00339429:
      ast::operator<<(pDVar6,this);
      return false;
    }
    iVar2 = Expression::bind((int)local_88,(sockaddr *)&ctx,0);
    pEVar5 = (Expression *)CONCAT44(extraout_var_00,iVar2);
    bVar1 = Expression::bad(pEVar5);
    if (bVar1) {
      return false;
    }
    bVar1 = Type::isCastCompatible(this,(pEVar5->type).ptr);
    if (!bVar1) {
      SVar7 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
      pDVar6 = ASTContext::addDiag(&ctx,(DiagCode)0x30007,SVar7);
      pDVar6 = ast::operator<<(pDVar6,(pEVar5->type).ptr);
      goto LAB_00339429;
    }
    if ((((formal->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
          _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged != true)
        || (1 < (formal->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
                _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload.
                _M_value - Out)) || (((formal->super_Symbol).parentScope)->thisSym->kind == Checker)
       ) {
LAB_003392e9:
      local_90 = pEVar5;
      std::
      variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
      ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                   *)result,&local_90);
      return true;
    }
    this_00 = (ValueSymbol *)Expression::getSymbolReference(pEVar5,true);
    if ((this_00 != (ValueSymbol *)0x0) && ((this_00->super_Symbol).kind == LocalAssertionVar)) {
      ValueSymbol::addDriver
                (this_00,Procedural,pEVar5,((context->scope).ptr)->thisSym,
                 (bitmask<slang::ast::AssignFlags>)0x40);
      goto LAB_003392e9;
    }
    SVar7 = pEVar5->sourceRange;
    code.subsystem = Expressions;
    code.code = 7;
    break;
  case UntypedType:
    if (local_88 != (int *)0x0) {
      iVar2 = Expression::bind((int)local_88,(sockaddr *)&ctx,0x200);
      local_90 = (Expression *)CONCAT44(extraout_var_01,iVar2);
      std::
      variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
      ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                   *)result,&local_90);
      bVar1 = Expression::bad((Expression *)CONCAT44(extraout_var_01,iVar2));
      return !bVar1;
    }
    ctx.flags.m_bits = ctx.flags.m_bits | 0x40000;
    goto LAB_003393b8;
  case SequenceType:
    if (local_80 != 0) {
      iVar2 = AssertionExpr::bind((int)local_80,(sockaddr *)&ctx,0);
      local_90 = (Expression *)CONCAT44(extraout_var_02,iVar2);
      if (local_90->kind != Invalid) {
        AssertionExpr::requireSequence((AssertionExpr *)local_90,&ctx);
        std::
        variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
        ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                     *)result,(AssertionExpr **)&local_90);
        return true;
      }
      return false;
    }
    SVar7 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
    code.subsystem = Expressions;
    code.code = 4;
    break;
  case PropertyType:
LAB_003393b8:
    iVar2 = AssertionExpr::bind((AssertionExpr *)propExpr,(int)&ctx,(sockaddr *)0x0,0);
    pEVar5 = (Expression *)CONCAT44(extraout_var_03,iVar2);
    local_90 = pEVar5;
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                 *)result,(AssertionExpr **)&local_90);
LAB_003393d7:
    return pEVar5->kind != Invalid;
  case ErrorType:
    goto LAB_00339436;
  }
  ASTContext::addDiag(&ctx,code,SVar7);
LAB_00339436:
  return false;
}

Assistant:

bool AssertionInstanceExpression::checkAssertionArg(const PropertyExprSyntax& propExpr,
                                                    const AssertionPortSymbol& formal,
                                                    const ASTContext& context, ActualArg& result,
                                                    bool isRecursiveProp) {
    auto [seqExpr, regExpr] = decomposePropExpr(propExpr);

    ASTContext ctx = context;
    if (isRecursiveProp && !formal.isLocalVar()) {
        // For every recursive instance of property q in the declaration of property p,
        // each actual argument expression e of the instance must satisfy at least one
        // of the following conditions:
        // 1. e is itself a formal argument of p.
        // 2. No formal argument of p appears in e.
        // 3. e is bound to a local variable formal argument of q.
        if (!regExpr)
            ctx.flags |= ASTFlags::RecursivePropertyArg;
        else {
            auto expr = regExpr;
            while (expr->kind == SyntaxKind::ParenthesizedExpression)
                expr = expr->as<ParenthesizedExpressionSyntax>().expression;

            // This check filters out cases where the entire argument is a formal argument.
            if (expr->kind != SyntaxKind::IdentifierName)
                ctx.flags |= ASTFlags::RecursivePropertyArg;
        }
    }

    auto& type = formal.declaredType.getType();
    switch (type.getCanonicalType().kind) {
        case SymbolKind::UntypedType:
            // Untyped formals allow everything. Bind here just so we notice things like
            // name resolution errors even if the argument ends up being unused in the
            // body of the sequence / property.
            if (regExpr) {
                auto& bound = Expression::bind(*regExpr, ctx, ASTFlags::AllowUnboundedLiteral);
                result = &bound;
                return !bound.bad();
            }
            else {
                ctx.flags |= ASTFlags::AssertionInstanceArgCheck;
                auto& bound = AssertionExpr::bind(propExpr, ctx);
                result = &bound;
                return !bound.bad();
            }
        case SymbolKind::SequenceType: {
            if (!seqExpr) {
                ctx.addDiag(diag::AssertionArgTypeSequence, propExpr.sourceRange());
                return false;
            }

            auto& bound = AssertionExpr::bind(*seqExpr, ctx);
            if (bound.bad())
                return false;

            bound.requireSequence(ctx);
            result = &bound;
            return true;
        }
        case SymbolKind::PropertyType: {
            auto& bound = AssertionExpr::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::EventType: {
            auto& bound = TimingControl::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::ErrorType:
            return false;
        default:
            break;
    }

    // For all other types, we need a normal expression that
    // is cast compatible with the target type.
    if (!regExpr) {
        ctx.addDiag(diag::AssertionArgNeedsRegExpr, propExpr.sourceRange()) << type;
        return false;
    }

    auto& bound = Expression::bind(*regExpr, ctx);
    if (bound.bad())
        return false;

    if (!type.isCastCompatible(*bound.type)) {
        ctx.addDiag(diag::AssertionArgTypeMismatch, propExpr.sourceRange()) << *bound.type << type;
        return false;
    }

    auto formalParent = formal.getParentScope();
    SLANG_ASSERT(formalParent);

    // Local var formals that are output or inout must bind only to another local var.
    if ((formal.direction == ArgumentDirection::InOut ||
         formal.direction == ArgumentDirection::Out) &&
        formalParent->asSymbol().kind != SymbolKind::Checker) {
        auto sym = bound.getSymbolReference();
        if (!sym || sym->kind != SymbolKind::LocalAssertionVar) {
            ctx.addDiag(diag::AssertionOutputLocalVar, bound.sourceRange);
            return false;
        }

        sym->as<ValueSymbol>().addDriver(DriverKind::Procedural, bound, context.scope->asSymbol(),
                                         AssignFlags::AssertionLocalVarFormalArg);
    }

    result = &bound;
    return true;
}